

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
* __thiscall
pstore::json::details::whitespace_matcher<pstore::exchange::import_ns::callbacks>::consume_body
          (pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
           *__return_storage_ptr__,whitespace_matcher<pstore::exchange::import_ns::callbacks> *this,
          parser<pstore::exchange::import_ns::callbacks> *parser,char c)

{
  bool bVar1;
  bool local_39;
  void *local_38;
  anon_class_8_1_8991fb9c local_30;
  anon_class_8_1_8991fb9c stop_retry;
  char c_local;
  parser<pstore::exchange::import_ns::callbacks> *parser_local;
  whitespace_matcher<pstore::exchange::import_ns::callbacks> *this_local;
  
  local_30.this = this;
  stop_retry.this._7_1_ = c;
  switch(c) {
  case '\t':
    break;
  case '\n':
    lf(this,parser);
    break;
  default:
    consume_body::anon_class_8_1_8991fb9c::operator()(__return_storage_ptr__,&local_30);
    return __return_storage_ptr__;
  case '\r':
    cr(this,parser,crlf_state);
    break;
  case ' ':
    break;
  case '#':
    bVar1 = parser<pstore::exchange::import_ns::callbacks>::extension_enabled(parser,bash_comments);
    if (!bVar1) {
      consume_body::anon_class_8_1_8991fb9c::operator()(__return_storage_ptr__,&local_30);
      return __return_storage_ptr__;
    }
    matcher<pstore::exchange::import_ns::callbacks>::set_state
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,4);
    break;
  case '/':
    bVar1 = parser<pstore::exchange::import_ns::callbacks>::extension_enabled
                      (parser,single_line_comments);
    if ((!bVar1) &&
       (bVar1 = parser<pstore::exchange::import_ns::callbacks>::extension_enabled
                          (parser,multi_line_comments), !bVar1)) {
      consume_body::anon_class_8_1_8991fb9c::operator()(__return_storage_ptr__,&local_30);
      return __return_storage_ptr__;
    }
    matcher<pstore::exchange::import_ns::callbacks>::set_state
              (&this->super_matcher<pstore::exchange::import_ns::callbacks>,5);
  }
  local_38 = (void *)0x0;
  local_39 = true;
  std::
  pair<std::unique_ptr<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<pstore::exchange::import_ns::callbacks>_>_>,_bool>
  ::pair<std::nullptr_t,_bool,_true>(__return_storage_ptr__,&local_38,&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            whitespace_matcher<Callbacks>::consume_body (parser<Callbacks> & parser, char c) {
                auto const stop_retry = [this] () {
                    // Stop, pop this matcher, and retry with the same character.
                    this->set_state (done_state);
                    return std::pair<typename matcher<Callbacks>::pointer, bool>{nullptr, false};
                };

                using details::char_set;
                switch (c) {
                case char_set::space: break; // Just consume.
                case char_set::tab:
                    // TODO: tab expansion.
                    break;
                case char_set::cr: this->cr (parser, crlf_state); break;
                case char_set::lf: this->lf (parser); break;
                case char_set::hash:
                    if (!parser.extension_enabled (extensions::bash_comments)) {
                        return stop_retry ();
                    }
                    this->set_state (single_line_comment_state);
                    break;
                case char_set::slash:
                    if (!parser.extension_enabled (extensions::single_line_comments) &&
                        !parser.extension_enabled (extensions::multi_line_comments)) {
                        return stop_retry ();
                    }
                    this->set_state (comment_start_state);
                    break;
                default: return stop_retry ();
                }
                return {nullptr, true}; // Consume this character.
            }